

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::sectionEnded(CumulativeReporterBase *this,SectionStats *sectionStats)

{
  pointer pPVar1;
  
  pPVar1 = (this->m_sectionStack).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pPVar1) {
    SectionStats::operator=(&(pPVar1[-1].m_p)->stats,sectionStats);
    std::
    vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
    ::pop_back(&this->m_sectionStack);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/3rdparty/Catch/include/catch.hpp"
                ,0x222f,
                "virtual void Catch::CumulativeReporterBase::sectionEnded(const SectionStats &)");
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }